

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.h
# Opt level: O2

float32 propagateFloat32NaN(float32 a,float32 b,float_status *status)

{
  FloatClass a_cls;
  float32 fVar1;
  int iVar2;
  uint32_t a_2;
  FloatClass b_cls;
  float_status *status_00;
  undefined4 in_register_0000003c;
  uint32_t a_1;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  
  if ((a & 0x7fffffff) < 0x7f800001) {
    a_cls = float_class_normal;
    if ((b & 0x7fffffff) < 0x7f800001) {
      bVar5 = false;
      b_cls = float_class_normal;
      goto LAB_00b19a78;
    }
LAB_00b19a2f:
    bVar3 = (b & 0x7fc00000) == 0x7f800000;
    bVar4 = (b & 0x3fffff) != 0;
    bVar5 = a_cls == float_class_snan;
    b_cls = float_class_snan;
    if (bVar5) {
      b_cls = (bVar4 && bVar3) + float_class_qnan;
    }
    if ((bVar4 && bVar3) || (a_cls == float_class_snan)) {
LAB_00b19a6d:
      status->float_exception_flags = status->float_exception_flags | 1;
      goto LAB_00b19a78;
    }
    b_cls = float_class_qnan;
  }
  else {
    bVar5 = (a & 0x7fc00000) == 0x7f800000;
    bVar3 = (a & 0x3fffff) != 0;
    if (0x7f800000 < (b & 0x7fffffff)) {
      a_cls = (bVar3 && bVar5) | float_class_qnan;
      goto LAB_00b19a2f;
    }
    b_cls = float_class_normal;
    if (bVar3 && bVar5) {
      bVar5 = true;
      a_cls = float_class_snan;
      goto LAB_00b19a6d;
    }
    a_cls = float_class_qnan;
  }
  bVar5 = false;
LAB_00b19a78:
  if (status->default_nan_mode != '\0') {
    fVar1 = float32_default_nan_tricore((float_status *)CONCAT44(in_register_0000003c,a));
    return fVar1;
  }
  if (a * 2 < b * 2) {
    bVar3 = false;
  }
  else {
    bVar3 = true;
    if (a * 2 <= b * 2) {
      bVar3 = a < b;
    }
  }
  status_00 = (float_status *)(ulong)b_cls;
  iVar2 = pickNaN(a_cls,b_cls,bVar3);
  if (iVar2 == 0) {
    if (!bVar5) {
      return a;
    }
  }
  else {
    a = b;
    if (b_cls != float_class_snan) {
      return b;
    }
  }
  fVar1 = float32_silence_nan_tricore(a,status_00);
  return fVar1;
}

Assistant:

static inline int float32_is_any_nan(float32 a)
{
    return ((float32_val(a) & ~(1 << 31)) > 0x7f800000UL);
}